

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.cpp
# Opt level: O2

XMLElement * __thiscall Kumu::XMLElement::AddChild(XMLElement *this,XMLElement *element)

{
  XMLElement *local_10;
  
  local_10 = element;
  std::__cxx11::list<Kumu::XMLElement_*,_std::allocator<Kumu::XMLElement_*>_>::push_back
            (&this->m_ChildList,&local_10);
  return local_10;
}

Assistant:

Kumu::XMLElement*
Kumu::XMLElement::AddChild(Kumu::XMLElement* element)
{
  m_ChildList.push_back(element); // takes posession!
  return element;
}